

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

void Abc_SclInstallGenlib(void *pScl,float SlewInit,float Gain,int nGatesMin)

{
  int iVar1;
  int iVar2;
  Vec_Str_t *vStr;
  Vec_Str_t *vStr2;
  char *__dest;
  int nGateCount;
  uint local_30;
  float local_2c;
  
  if ((SlewInit == 0.0) && (!NAN(SlewInit))) {
    SlewInit = Abc_SclComputeAverageSlew((SC_Lib *)pScl);
  }
  local_30 = *(uint *)((long)pScl + 100);
  local_2c = SlewInit;
  if ((Gain != 0.0) || (NAN(Gain))) {
    vStr = Abc_SclProduceGenlibStr((SC_Lib *)pScl,SlewInit,Gain,nGatesMin,(int *)&local_30);
  }
  else {
    vStr = Abc_SclProduceGenlibStrSimple((SC_Lib *)pScl);
  }
  vStr2 = (Vec_Str_t *)malloc(0x10);
  iVar2 = vStr->nSize;
  vStr2->nSize = iVar2;
  iVar1 = vStr->nCap;
  vStr2->nCap = iVar1;
  if ((long)iVar1 == 0) {
    __dest = (char *)0x0;
  }
  else {
    __dest = (char *)malloc((long)iVar1);
  }
  vStr2->pArray = __dest;
  memcpy(__dest,vStr->pArray,(long)iVar2);
  iVar2 = Mio_UpdateGenlib2(vStr,vStr2,*pScl,0);
  if (vStr->pArray != (char *)0x0) {
    free(vStr->pArray);
    vStr->pArray = (char *)0x0;
  }
  free(vStr);
  if (vStr2->pArray != (char *)0x0) {
    free(vStr2->pArray);
    vStr2->pArray = (char *)0x0;
  }
  free(vStr2);
  if (iVar2 == 0) {
    puts("Reading library has filed.");
  }
  else if ((Gain != 0.0) || (NAN(Gain))) {
    printf("Derived GENLIB library \"%s\" with %d gates using slew %.2f ps and gain %.2f.\n",
           (double)local_2c,(double)Gain,*pScl,(ulong)local_30);
  }
  return;
}

Assistant:

void Abc_SclInstallGenlib( void * pScl, float SlewInit, float Gain, int nGatesMin )
{
    SC_Lib * p = (SC_Lib *)pScl;
    Vec_Str_t * vStr, * vStr2;
    float Slew = (SlewInit == 0) ? Abc_SclComputeAverageSlew(p) : SlewInit;
    int RetValue, nGateCount = SC_LibCellNum(p);
    if ( Gain == 0 )
        vStr = Abc_SclProduceGenlibStrSimple(p);
    else
        vStr = Abc_SclProduceGenlibStr( p, Slew, Gain, nGatesMin, &nGateCount );
    vStr2 = Vec_StrDup( vStr );
    RetValue = Mio_UpdateGenlib2( vStr, vStr2, p->pName, 0 );
    Vec_StrFree( vStr );
    Vec_StrFree( vStr2 );
    if ( !RetValue )
        printf( "Reading library has filed.\n" );
    else if ( Gain != 0 )
        printf( "Derived GENLIB library \"%s\" with %d gates using slew %.2f ps and gain %.2f.\n", p->pName, nGateCount, Slew, Gain );
//    else
//        printf( "Derived unit-delay GENLIB library \"%s\" with %d gates.\n", p->pName, nGateCount );
}